

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_extension.cpp
# Opt level: O3

void duckdb::ParquetMultiFileInfo::GetVirtualColumns
               (ClientContext *param_1,MultiFileBindData *param_2,virtual_column_map_t *result)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  size_type local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  LogicalType local_b8 [24];
  TableColumn local_a0;
  pair<unsigned_long,_duckdb::TableColumn> local_68;
  
  local_d8 = &local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"file_row_number","");
  duckdb::LogicalType::LogicalType(local_b8,BIGINT);
  paVar1 = &local_a0.name.field_2;
  if (local_d8 == &local_c8) {
    local_a0.name.field_2._8_8_ = local_c8._8_8_;
    local_a0.name._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_a0.name._M_dataplus._M_p = (pointer)local_d8;
  }
  local_a0.name._M_string_length = local_d0;
  local_d0 = 0;
  local_c8._M_local_buf[0] = '\0';
  local_d8 = &local_c8;
  duckdb::LogicalType::LogicalType(&local_a0.type,local_b8);
  std::pair<unsigned_long,_duckdb::TableColumn>::pair<duckdb::TableColumn,_true>
            (&local_68,&MultiFileReader::COLUMN_IDENTIFIER_FILE_ROW_NUMBER,&local_a0);
  std::
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::TableColumn>,std::allocator<std::pair<unsigned_long_const,duckdb::TableColumn>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<unsigned_long,duckdb::TableColumn>>
            ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::TableColumn>,std::allocator<std::pair<unsigned_long_const,duckdb::TableColumn>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)result,&local_68);
  duckdb::LogicalType::~LogicalType(&local_68.second.type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.second.name._M_dataplus._M_p != &local_68.second.name.field_2) {
    operator_delete(local_68.second.name._M_dataplus._M_p);
  }
  duckdb::LogicalType::~LogicalType(&local_a0.type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0.name._M_dataplus._M_p);
  }
  duckdb::LogicalType::~LogicalType(local_b8);
  if (local_d8 != &local_c8) {
    operator_delete(local_d8);
  }
  return;
}

Assistant:

void ParquetMultiFileInfo::GetVirtualColumns(ClientContext &, MultiFileBindData &, virtual_column_map_t &result) {
	result.insert(make_pair(MultiFileReader::COLUMN_IDENTIFIER_FILE_ROW_NUMBER,
	                        TableColumn("file_row_number", LogicalType::BIGINT)));
}